

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O2

HRESULT __thiscall
ChakraCoreHostScriptContext::NotifyHostAboutModuleReady
          (ChakraCoreHostScriptContext *this,ModuleRecordBase *referencingModule,Var exceptionVar)

{
  JsErrorCode JVar1;
  HRESULT HVar2;
  AutoFilterExceptionRegion local_24 [2];
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  if (this->notifyModuleReadyCallback == (NotifyModuleReadyCallback)0x0) {
    HVar2 = -0x7ff8ffa9;
  }
  else {
    AutoFilterExceptionRegion::AutoFilterExceptionRegion(local_24,ExceptionType_All);
    JVar1 = (*this->notifyModuleReadyCallback)(referencingModule,exceptionVar);
    AutoFilterExceptionRegion::~AutoFilterExceptionRegion(local_24);
    HVar2 = -0x7ff8ffa9;
    if (JVar1 == JsNoError) {
      HVar2 = 0;
    }
  }
  return HVar2;
}

Assistant:

HRESULT ChakraCoreHostScriptContext::NotifyHostAboutModuleReady(Js::ModuleRecordBase* referencingModule, Js::Var exceptionVar)
{
    if (notifyModuleReadyCallback == nullptr)
    {
        return E_INVALIDARG;
    }
    {
        AUTO_NO_EXCEPTION_REGION;
        JsErrorCode errorCode = notifyModuleReadyCallback(referencingModule, exceptionVar);
        if (errorCode == JsNoError)
        {
            return NOERROR;
        }
    }
    return E_INVALIDARG;
}